

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_test.cpp
# Opt level: O0

void __thiscall compute_boundary_test_1::test_method(compute_boundary_test_1 *this)

{
  allocator<unsigned_long> *this_00;
  allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *this_01;
  allocator<double> *this_02;
  allocator<unsigned_int> *this_03;
  value_type vVar1;
  initializer_list<unsigned_int> __l;
  initializer_list<double> __l_00;
  initializer_list<unsigned_long> __l_01;
  initializer_list<unsigned_long> __l_02;
  initializer_list<unsigned_long> __l_03;
  initializer_list<unsigned_long> __l_04;
  initializer_list<unsigned_long> __l_05;
  initializer_list<unsigned_long> __l_06;
  initializer_list<unsigned_long> __l_07;
  initializer_list<unsigned_long> __l_08;
  initializer_list<unsigned_long> __l_09;
  initializer_list<unsigned_long> __l_10;
  initializer_list<unsigned_long> __l_11;
  initializer_list<unsigned_long> __l_12;
  initializer_list<unsigned_long> __l_13;
  initializer_list<unsigned_long> __l_14;
  initializer_list<unsigned_long> __l_15;
  initializer_list<unsigned_long> __l_16;
  initializer_list<unsigned_long> __l_17;
  initializer_list<unsigned_long> __l_18;
  initializer_list<unsigned_long> __l_19;
  initializer_list<unsigned_long> __l_20;
  initializer_list<unsigned_long> __l_21;
  initializer_list<unsigned_long> __l_22;
  initializer_list<unsigned_long> __l_23;
  initializer_list<unsigned_long> __l_24;
  initializer_list<unsigned_long> __l_25;
  initializer_list<unsigned_long> __l_26;
  initializer_list<unsigned_long> __l_27;
  initializer_list<unsigned_long> __l_28;
  initializer_list<unsigned_long> __l_29;
  initializer_list<unsigned_long> __l_30;
  initializer_list<unsigned_long> __l_31;
  initializer_list<unsigned_long> __l_32;
  initializer_list<unsigned_long> __l_33;
  initializer_list<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> __l_34;
  undefined8 uVar2;
  size_type sVar3;
  pointer puVar4;
  bool bVar5;
  pointer puVar6;
  size_type sVar7;
  reference this_04;
  reference pvVar8;
  lazy_ostream *prev;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_ea8;
  basic_cstring<const_char> local_c88;
  basic_cstring<const_char> local_c78;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_c68;
  assertion_result local_c48;
  basic_cstring<const_char> local_c30;
  basic_cstring<const_char> local_c20;
  size_type local_c10;
  size_t j;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bd;
  size_t i;
  Bitmap_cubical_complex increasing;
  uint local_b60 [2];
  iterator local_b58;
  size_type local_b50;
  undefined1 local_b48 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> dimensions;
  double local_b28 [10];
  iterator local_ad8;
  size_type local_ad0;
  undefined1 local_ac8 [8];
  vector<double,_std::allocator<double>_> increasingFiltrationOfTopDimensionalCells;
  unsigned_long local_aa8 [2];
  iterator local_a98;
  size_type local_a90;
  allocator<unsigned_long> local_a81;
  unsigned_long local_a80 [2];
  iterator local_a70;
  size_type local_a68;
  allocator<unsigned_long> local_a59;
  unsigned_long local_a58 [2];
  iterator local_a48;
  size_type local_a40;
  allocator<unsigned_long> local_a31;
  unsigned_long local_a30 [2];
  iterator local_a20;
  size_type local_a18;
  allocator<unsigned_long> local_a09;
  unsigned_long local_a08 [4];
  iterator local_9e8;
  size_type local_9e0;
  allocator<unsigned_long> local_9d1;
  unsigned_long local_9d0 [2];
  iterator local_9c0;
  size_type local_9b8;
  allocator<unsigned_long> local_9a9;
  unsigned_long local_9a8 [4];
  iterator local_988;
  size_type local_980;
  allocator<unsigned_long> local_971;
  unsigned_long local_970 [2];
  iterator local_960;
  size_type local_958;
  allocator<unsigned_long> local_949;
  unsigned_long local_948 [4];
  iterator local_928;
  size_type local_920;
  allocator<unsigned_long> local_911;
  unsigned_long local_910 [2];
  iterator local_900;
  size_type local_8f8;
  allocator<unsigned_long> local_8e9;
  unsigned_long local_8e8 [2];
  iterator local_8d8;
  size_type local_8d0;
  allocator<unsigned_long> local_8c1;
  unsigned_long local_8c0 [2];
  iterator local_8b0;
  size_type local_8a8;
  allocator<unsigned_long> local_899;
  unsigned_long local_898 [2];
  iterator local_888;
  size_type local_880;
  allocator<unsigned_long> local_871;
  unsigned_long local_870 [2];
  iterator local_860;
  size_type local_858;
  allocator<unsigned_long> local_849;
  unsigned_long local_848 [4];
  iterator local_828;
  size_type local_820;
  allocator<unsigned_long> local_811;
  unsigned_long local_810 [2];
  iterator local_800;
  size_type local_7f8;
  allocator<unsigned_long> local_7e9;
  unsigned_long local_7e8 [4];
  iterator local_7c8;
  size_type local_7c0;
  allocator<unsigned_long> local_7b1;
  unsigned_long local_7b0 [2];
  iterator local_7a0;
  size_type local_798;
  allocator<unsigned_long> local_789;
  unsigned_long local_788 [4];
  iterator local_768;
  size_type local_760;
  allocator<unsigned_long> local_751;
  unsigned_long local_750 [2];
  iterator local_740;
  size_type local_738;
  allocator<unsigned_long> local_729;
  unsigned_long local_728 [2];
  iterator local_718;
  size_type local_710;
  allocator<unsigned_long> local_701;
  unsigned_long local_700 [2];
  iterator local_6f0;
  size_type local_6e8;
  allocator<unsigned_long> local_6d9;
  unsigned_long local_6d8 [2];
  iterator local_6c8;
  size_type local_6c0;
  allocator<unsigned_long> local_6b1;
  unsigned_long local_6b0 [2];
  iterator local_6a0;
  size_type local_698;
  allocator<unsigned_long> local_689;
  unsigned_long local_688 [4];
  iterator local_668;
  size_type local_660;
  allocator<unsigned_long> local_651;
  unsigned_long local_650 [2];
  iterator local_640;
  size_type local_638;
  allocator<unsigned_long> local_629;
  unsigned_long local_628 [4];
  iterator local_608;
  size_type local_600;
  allocator<unsigned_long> local_5f1;
  unsigned_long local_5f0 [2];
  iterator local_5e0;
  size_type local_5d8;
  allocator<unsigned_long> local_5c9;
  unsigned_long local_5c8 [5];
  iterator local_5a0;
  size_type local_598;
  allocator<unsigned_long> local_589;
  unsigned_long local_588 [2];
  iterator local_578;
  size_type local_570;
  allocator<unsigned_long> local_561;
  unsigned_long local_560 [2];
  iterator local_550;
  size_type local_548;
  allocator<unsigned_long> local_539;
  unsigned_long local_538 [2];
  iterator local_528;
  size_type local_520;
  allocator<unsigned_long> local_501;
  unsigned_long local_500 [2];
  iterator local_4f0;
  size_type local_4e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_4e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_4d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_4c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_4a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_490;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_478;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_460;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_448;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_430;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_418;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_400;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_388;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_370;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_358;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_340;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_328;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_310;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_298;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_280;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_268;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_250;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_238;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_220;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_208;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_190;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_178;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_160;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_148;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_130;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_118;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_100;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vStack_40;
  undefined1 local_28 [8];
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  boundaries;
  compute_boundary_test_1 *this_local;
  
  increasingFiltrationOfTopDimensionalCells.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  local_4e0 = &local_4d8;
  local_4d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  boundaries.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(local_4e0);
  local_500[0] = 0;
  local_500[1] = 2;
  local_4f0 = local_500;
  local_4e8 = 2;
  local_4e0 = &local_4c0;
  std::allocator<unsigned_long>::allocator(&local_501);
  __l_33._M_len = local_4e8;
  __l_33._M_array = local_4f0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_4c0,__l_33,&local_501);
  local_4e0 = &local_4a8;
  local_4a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(local_4e0);
  local_538[0] = 2;
  local_538[1] = 4;
  local_528 = local_538;
  local_520 = 2;
  local_4e0 = &local_490;
  std::allocator<unsigned_long>::allocator(&local_539);
  __l_32._M_len = local_520;
  __l_32._M_array = local_528;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_490,__l_32,&local_539);
  local_4e0 = &local_478;
  local_478.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_478.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_478.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(local_4e0);
  local_560[0] = 4;
  local_560[1] = 6;
  local_550 = local_560;
  local_548 = 2;
  local_4e0 = &local_460;
  std::allocator<unsigned_long>::allocator(&local_561);
  __l_31._M_len = local_548;
  __l_31._M_array = local_550;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_460,__l_31,&local_561);
  local_4e0 = &local_448;
  local_448.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_448.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(local_4e0);
  local_588[0] = 0;
  local_588[1] = 0xe;
  local_578 = local_588;
  local_570 = 2;
  local_4e0 = &local_430;
  std::allocator<unsigned_long>::allocator(&local_589);
  __l_30._M_len = local_570;
  __l_30._M_array = local_578;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_430,__l_30,&local_589);
  local_5c8[2] = 9;
  local_5c8[3] = 7;
  local_5c8[0] = 1;
  local_5c8[1] = 0xf;
  local_5a0 = local_5c8;
  local_598 = 4;
  local_4e0 = &local_418;
  std::allocator<unsigned_long>::allocator(&local_5c9);
  __l_29._M_len = local_598;
  __l_29._M_array = local_5a0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_418,__l_29,&local_5c9);
  local_5f0[0] = 2;
  local_5f0[1] = 0x10;
  local_5e0 = local_5f0;
  local_5d8 = 2;
  local_4e0 = &local_400;
  std::allocator<unsigned_long>::allocator(&local_5f1);
  __l_28._M_len = local_5d8;
  __l_28._M_array = local_5e0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_400,__l_28,&local_5f1);
  local_628[2] = 0xb;
  local_628[3] = 9;
  local_628[0] = 3;
  local_628[1] = 0x11;
  local_608 = local_628;
  local_600 = 4;
  local_4e0 = &local_3e8;
  std::allocator<unsigned_long>::allocator(&local_629);
  __l_27._M_len = local_600;
  __l_27._M_array = local_608;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_3e8,__l_27,&local_629);
  local_650[0] = 4;
  local_650[1] = 0x12;
  local_640 = local_650;
  local_638 = 2;
  local_4e0 = &local_3d0;
  std::allocator<unsigned_long>::allocator(&local_651);
  __l_26._M_len = local_638;
  __l_26._M_array = local_640;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_3d0,__l_26,&local_651);
  local_688[2] = 0xd;
  local_688[3] = 0xb;
  local_688[0] = 5;
  local_688[1] = 0x13;
  local_668 = local_688;
  local_660 = 4;
  local_4e0 = &local_3b8;
  std::allocator<unsigned_long>::allocator(&local_689);
  __l_25._M_len = local_660;
  __l_25._M_array = local_668;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_3b8,__l_25,&local_689);
  local_6b0[0] = 6;
  local_6b0[1] = 0x14;
  local_6a0 = local_6b0;
  local_698 = 2;
  local_4e0 = &local_3a0;
  std::allocator<unsigned_long>::allocator(&local_6b1);
  __l_24._M_len = local_698;
  __l_24._M_array = local_6a0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_3a0,__l_24,&local_6b1);
  local_4e0 = &local_388;
  local_388.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_388.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_388.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(local_4e0);
  local_6d8[0] = 0xe;
  local_6d8[1] = 0x10;
  local_6c8 = local_6d8;
  local_6c0 = 2;
  local_4e0 = &local_370;
  std::allocator<unsigned_long>::allocator(&local_6d9);
  __l_23._M_len = local_6c0;
  __l_23._M_array = local_6c8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_370,__l_23,&local_6d9);
  local_4e0 = &local_358;
  local_358.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(local_4e0);
  local_700[0] = 0x10;
  local_700[1] = 0x12;
  local_6f0 = local_700;
  local_6e8 = 2;
  local_4e0 = &local_340;
  std::allocator<unsigned_long>::allocator(&local_701);
  __l_22._M_len = local_6e8;
  __l_22._M_array = local_6f0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_340,__l_22,&local_701);
  local_4e0 = &local_328;
  local_328.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(local_4e0);
  local_728[0] = 0x12;
  local_728[1] = 0x14;
  local_718 = local_728;
  local_710 = 2;
  local_4e0 = &local_310;
  std::allocator<unsigned_long>::allocator(&local_729);
  __l_21._M_len = local_710;
  __l_21._M_array = local_718;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_310,__l_21,&local_729);
  local_4e0 = &local_2f8;
  local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(local_4e0);
  local_750[0] = 0xe;
  local_750[1] = 0x1c;
  local_740 = local_750;
  local_738 = 2;
  local_4e0 = &local_2e0;
  std::allocator<unsigned_long>::allocator(&local_751);
  __l_20._M_len = local_738;
  __l_20._M_array = local_740;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_2e0,__l_20,&local_751);
  local_788[2] = 0x17;
  local_788[3] = 0x15;
  local_788[0] = 0xf;
  local_788[1] = 0x1d;
  local_768 = local_788;
  local_760 = 4;
  local_4e0 = &local_2c8;
  std::allocator<unsigned_long>::allocator(&local_789);
  __l_19._M_len = local_760;
  __l_19._M_array = local_768;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_2c8,__l_19,&local_789);
  local_7b0[0] = 0x10;
  local_7b0[1] = 0x1e;
  local_7a0 = local_7b0;
  local_798 = 2;
  local_4e0 = &local_2b0;
  std::allocator<unsigned_long>::allocator(&local_7b1);
  __l_18._M_len = local_798;
  __l_18._M_array = local_7a0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_2b0,__l_18,&local_7b1);
  local_7e8[2] = 0x19;
  local_7e8[3] = 0x17;
  local_7e8[0] = 0x11;
  local_7e8[1] = 0x1f;
  local_7c8 = local_7e8;
  local_7c0 = 4;
  local_4e0 = &local_298;
  std::allocator<unsigned_long>::allocator(&local_7e9);
  __l_17._M_len = local_7c0;
  __l_17._M_array = local_7c8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_298,__l_17,&local_7e9);
  local_810[0] = 0x12;
  local_810[1] = 0x20;
  local_800 = local_810;
  local_7f8 = 2;
  local_4e0 = &local_280;
  std::allocator<unsigned_long>::allocator(&local_811);
  __l_16._M_len = local_7f8;
  __l_16._M_array = local_800;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_280,__l_16,&local_811);
  local_848[2] = 0x1b;
  local_848[3] = 0x19;
  local_848[0] = 0x13;
  local_848[1] = 0x21;
  local_828 = local_848;
  local_820 = 4;
  local_4e0 = &local_268;
  std::allocator<unsigned_long>::allocator(&local_849);
  __l_15._M_len = local_820;
  __l_15._M_array = local_828;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_268,__l_15,&local_849);
  local_870[0] = 0x14;
  local_870[1] = 0x22;
  local_860 = local_870;
  local_858 = 2;
  local_4e0 = &local_250;
  std::allocator<unsigned_long>::allocator(&local_871);
  __l_14._M_len = local_858;
  __l_14._M_array = local_860;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_250,__l_14,&local_871);
  local_4e0 = &local_238;
  local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(local_4e0);
  local_898[0] = 0x1c;
  local_898[1] = 0x1e;
  local_888 = local_898;
  local_880 = 2;
  local_4e0 = &local_220;
  std::allocator<unsigned_long>::allocator(&local_899);
  __l_13._M_len = local_880;
  __l_13._M_array = local_888;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_220,__l_13,&local_899);
  local_4e0 = &local_208;
  local_208.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(local_4e0);
  local_8c0[0] = 0x1e;
  local_8c0[1] = 0x20;
  local_8b0 = local_8c0;
  local_8a8 = 2;
  local_4e0 = &local_1f0;
  std::allocator<unsigned_long>::allocator(&local_8c1);
  __l_12._M_len = local_8a8;
  __l_12._M_array = local_8b0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_1f0,__l_12,&local_8c1);
  local_4e0 = &local_1d8;
  local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(local_4e0);
  local_8e8[0] = 0x20;
  local_8e8[1] = 0x22;
  local_8d8 = local_8e8;
  local_8d0 = 2;
  local_4e0 = &local_1c0;
  std::allocator<unsigned_long>::allocator(&local_8e9);
  __l_11._M_len = local_8d0;
  __l_11._M_array = local_8d8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_1c0,__l_11,&local_8e9);
  local_4e0 = &local_1a8;
  local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(local_4e0);
  local_910[0] = 0x1c;
  local_910[1] = 0x2a;
  local_900 = local_910;
  local_8f8 = 2;
  local_4e0 = &local_190;
  std::allocator<unsigned_long>::allocator(&local_911);
  __l_10._M_len = local_8f8;
  __l_10._M_array = local_900;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_190,__l_10,&local_911);
  local_948[2] = 0x25;
  local_948[3] = 0x23;
  local_948[0] = 0x1d;
  local_948[1] = 0x2b;
  local_928 = local_948;
  local_920 = 4;
  local_4e0 = &local_178;
  std::allocator<unsigned_long>::allocator(&local_949);
  __l_09._M_len = local_920;
  __l_09._M_array = local_928;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_178,__l_09,&local_949);
  local_970[0] = 0x1e;
  local_970[1] = 0x2c;
  local_960 = local_970;
  local_958 = 2;
  local_4e0 = &local_160;
  std::allocator<unsigned_long>::allocator(&local_971);
  __l_08._M_len = local_958;
  __l_08._M_array = local_960;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_160,__l_08,&local_971);
  local_9a8[2] = 0x27;
  local_9a8[3] = 0x25;
  local_9a8[0] = 0x1f;
  local_9a8[1] = 0x2d;
  local_988 = local_9a8;
  local_980 = 4;
  local_4e0 = &local_148;
  std::allocator<unsigned_long>::allocator(&local_9a9);
  __l_07._M_len = local_980;
  __l_07._M_array = local_988;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_148,__l_07,&local_9a9);
  local_9d0[0] = 0x20;
  local_9d0[1] = 0x2e;
  local_9c0 = local_9d0;
  local_9b8 = 2;
  local_4e0 = &local_130;
  std::allocator<unsigned_long>::allocator(&local_9d1);
  __l_06._M_len = local_9b8;
  __l_06._M_array = local_9c0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_130,__l_06,&local_9d1);
  local_a08[2] = 0x29;
  local_a08[3] = 0x27;
  local_a08[0] = 0x21;
  local_a08[1] = 0x2f;
  local_9e8 = local_a08;
  local_9e0 = 4;
  local_4e0 = &local_118;
  std::allocator<unsigned_long>::allocator(&local_a09);
  __l_05._M_len = local_9e0;
  __l_05._M_array = local_9e8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_118,__l_05,&local_a09);
  local_a30[0] = 0x22;
  local_a30[1] = 0x30;
  local_a20 = local_a30;
  local_a18 = 2;
  local_4e0 = &local_100;
  std::allocator<unsigned_long>::allocator(&local_a31);
  __l_04._M_len = local_a18;
  __l_04._M_array = local_a20;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_100,__l_04,&local_a31);
  local_4e0 = &local_e8;
  local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(local_4e0);
  local_a58[0] = 0x2a;
  local_a58[1] = 0x2c;
  local_a48 = local_a58;
  local_a40 = 2;
  local_4e0 = &local_d0;
  std::allocator<unsigned_long>::allocator(&local_a59);
  __l_03._M_len = local_a40;
  __l_03._M_array = local_a48;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_d0,__l_03,&local_a59);
  local_4e0 = &local_b8;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(local_4e0);
  local_a80[0] = 0x2c;
  local_a80[1] = 0x2e;
  local_a70 = local_a80;
  local_a68 = 2;
  local_4e0 = &local_a0;
  std::allocator<unsigned_long>::allocator(&local_a81);
  __l_02._M_len = local_a68;
  __l_02._M_array = local_a70;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_a0,__l_02,&local_a81);
  local_4e0 = &local_88;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(local_4e0);
  local_aa8[0] = 0x2e;
  local_aa8[1] = 0x30;
  local_a98 = local_aa8;
  local_a90 = 2;
  this_00 = (allocator<unsigned_long> *)
            ((long)&increasingFiltrationOfTopDimensionalCells.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  local_4e0 = &local_70;
  std::allocator<unsigned_long>::allocator(this_00);
  __l_01._M_len = local_a90;
  __l_01._M_array = local_a98;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_70,__l_01,this_00);
  local_4e0 = &local_58;
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(local_4e0);
  increasingFiltrationOfTopDimensionalCells.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  vStack_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&local_4d8;
  vStack_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x31;
  this_01 = (allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
            ((long)&increasingFiltrationOfTopDimensionalCells.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::allocator(this_01);
  __l_34._M_len =
       (size_type)
       vStack_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  __l_34._M_array =
       (iterator)
       vStack_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)local_28,__l_34,this_01);
  std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~allocator
            ((allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             ((long)&increasingFiltrationOfTopDimensionalCells.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 5));
  local_ea8 = &vStack_40;
  do {
    local_ea8 = local_ea8 + -1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(local_ea8);
  } while (local_ea8 != &local_4d8);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&increasingFiltrationOfTopDimensionalCells.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<unsigned_long>::~allocator(&local_a81);
  std::allocator<unsigned_long>::~allocator(&local_a59);
  std::allocator<unsigned_long>::~allocator(&local_a31);
  std::allocator<unsigned_long>::~allocator(&local_a09);
  std::allocator<unsigned_long>::~allocator(&local_9d1);
  std::allocator<unsigned_long>::~allocator(&local_9a9);
  std::allocator<unsigned_long>::~allocator(&local_971);
  std::allocator<unsigned_long>::~allocator(&local_949);
  std::allocator<unsigned_long>::~allocator(&local_911);
  std::allocator<unsigned_long>::~allocator(&local_8e9);
  std::allocator<unsigned_long>::~allocator(&local_8c1);
  std::allocator<unsigned_long>::~allocator(&local_899);
  std::allocator<unsigned_long>::~allocator(&local_871);
  std::allocator<unsigned_long>::~allocator(&local_849);
  std::allocator<unsigned_long>::~allocator(&local_811);
  std::allocator<unsigned_long>::~allocator(&local_7e9);
  std::allocator<unsigned_long>::~allocator(&local_7b1);
  std::allocator<unsigned_long>::~allocator(&local_789);
  std::allocator<unsigned_long>::~allocator(&local_751);
  std::allocator<unsigned_long>::~allocator(&local_729);
  std::allocator<unsigned_long>::~allocator(&local_701);
  std::allocator<unsigned_long>::~allocator(&local_6d9);
  std::allocator<unsigned_long>::~allocator(&local_6b1);
  std::allocator<unsigned_long>::~allocator(&local_689);
  std::allocator<unsigned_long>::~allocator(&local_651);
  std::allocator<unsigned_long>::~allocator(&local_629);
  std::allocator<unsigned_long>::~allocator(&local_5f1);
  std::allocator<unsigned_long>::~allocator(&local_5c9);
  std::allocator<unsigned_long>::~allocator(&local_589);
  std::allocator<unsigned_long>::~allocator(&local_561);
  std::allocator<unsigned_long>::~allocator(&local_539);
  std::allocator<unsigned_long>::~allocator(&local_501);
  local_b28[8] = 9.0;
  local_b28[6] = 7.0;
  local_b28[7] = 8.0;
  local_b28[4] = 5.0;
  local_b28[5] = 6.0;
  local_b28[2] = 3.0;
  local_b28[3] = 4.0;
  local_b28[0] = 1.0;
  local_b28[1] = 2.0;
  local_ad8 = local_b28;
  local_ad0 = 9;
  this_02 = (allocator<double> *)
            ((long)&dimensions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(this_02);
  __l_00._M_len = local_ad0;
  __l_00._M_array = local_ad8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_ac8,__l_00,this_02);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&dimensions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_b60[0] = 3;
  local_b60[1] = 3;
  local_b58 = local_b60;
  local_b50 = 2;
  this_03 = (allocator<unsigned_int> *)
            ((long)&increasing.sorted_cells.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_int>::allocator(this_03);
  __l._M_len = local_b50;
  __l._M_array = local_b58;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b48,__l,this_03);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&increasing.sorted_cells.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  Gudhi::cubical_complex::
  Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
  Bitmap_cubical_complex
            ((Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_> *
             )&i,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b48,
             (vector<double,_std::allocator<double>_> *)local_ac8,true);
  for (bd.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      puVar4 = bd.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,
      puVar6 = (pointer)Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::size
                                  ((Bitmap_cubical_complex_base<double> *)&i), puVar4 != puVar6;
      bd.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)bd.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
    Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::get_boundary_of_a_cell
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&j,
               (Bitmap_cubical_complex_base<double> *)&i,
               (size_t)bd.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    for (local_c10 = 0; sVar3 = local_c10,
        sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&j),
        sVar3 != sVar7; local_c10 = local_c10 + 1) {
      do {
        uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_c20,
                   "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
                   ,0x75);
        boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_c30);
        boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_c20,0x91,&local_c30);
        this_04 = std::
                  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                *)local_28,
                               (size_type)
                               bd.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (this_04,local_c10);
        vVar1 = *pvVar8;
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&j,local_c10);
        boost::test_tools::assertion_result::assertion_result(&local_c48,vVar1 == *pvVar8);
        prev = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_c78,"boundaries[i][j] == bd[j]",0x19);
        boost::unit_test::operator<<(&local_c68,prev,&local_c78);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_c88,
                   "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
                   ,0x75);
        boost::test_tools::tt_detail::report_assertion(&local_c48,&local_c68,&local_c88,0x91,1,0,0);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl(&local_c68);
        boost::test_tools::assertion_result::~assertion_result(&local_c48);
        bVar5 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar5);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&j);
  }
  Gudhi::cubical_complex::
  Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
  ~Bitmap_cubical_complex
            ((Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_> *
             )&i);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b48);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_ac8);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)local_28);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(compute_boundary_test_1) {
  std::vector<std::vector<size_t> > boundaries {
    {},
    {0, 2},
    {},
    {2, 4},
    {},
    {4, 6},
    {},
    {0, 14},
    {1, 15, 9, 7},
    {2, 16},
    {3, 17, 11, 9},
    {4, 18},
    {5, 19, 13, 11},
    {6, 20},
    {},
    {14, 16},
    {},
    {16, 18},
    {},
    {18, 20},
    {},
    {14, 28},
    {15, 29, 23, 21},
    {16, 30},
    {17, 31, 25, 23},
    {18, 32},
    {19, 33, 27, 25},
    {20, 34},
    {},
    {28, 30},
    {},
    {30, 32},
    {},
    {32, 34},
    {},
    {28, 42},
    {29, 43, 37, 35},
    {30, 44},
    {31, 45, 39, 37},
    {32, 46},
    {33, 47, 41, 39},
    {34, 48},
    {},
    {42, 44},
    {},
    {44, 46},
    {},
    {46, 48},
    {}
  };

  std::vector<double> increasingFiltrationOfTopDimensionalCells({1, 2, 3, 4, 5, 6, 7, 8, 9});

  std::vector<unsigned> dimensions({3, 3});

  Bitmap_cubical_complex increasing(dimensions, increasingFiltrationOfTopDimensionalCells);
  for (size_t i = 0; i != increasing.size(); ++i) {
    std::vector<size_t> bd = increasing.get_boundary_of_a_cell(i);
    for (size_t j = 0; j != bd.size(); ++j) {
      BOOST_CHECK(boundaries[i][j] == bd[j]);
    }
  }
}